

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::checkFirstWord
          (HMpsFF *this,string *strline,size_t *start,size_t *end,string *word)

{
  Parsekey PVar1;
  bool bVar2;
  size_t sVar3;
  Parsekey PVar4;
  string upper_word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar3 = std::__cxx11::string::find_first_not_of((char *)strline,0x399f09);
  *start = sVar3;
  sVar3 = sVar3 + 1;
  if (sVar3 != strline->_M_string_length) {
    bVar2 = is_empty((strline->_M_dataplus)._M_p[sVar3],&default_non_chars_abi_cxx11_);
    sVar3 = *start + 1;
    if (!bVar2) {
      sVar3 = first_word_end(strline,sVar3);
      *end = sVar3;
      std::__cxx11::string::substr((ulong)&upper_word,(ulong)strline);
      std::__cxx11::string::operator=((string *)word,(string *)&upper_word);
      std::__cxx11::string::~string((string *)&upper_word);
      std::__cxx11::string::string((string *)&upper_word,(string *)word);
      toupper((int)&upper_word);
      bVar2 = std::operator==(&upper_word,"QCMATRIX");
      if (((bVar2) || (bVar2 = std::operator==(&upper_word,"QSECTION"), bVar2)) ||
         (bVar2 = std::operator==(&upper_word,"CSECTION"), bVar2)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)strline);
        std::__cxx11::string::operator=((string *)&this->section_args,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      bVar2 = std::operator==(&upper_word,"NAME");
      PVar4 = kName;
      if (!bVar2) {
        bVar2 = std::operator==(&upper_word,"OBJSENSE");
        if (bVar2) {
          PVar4 = kObjsense;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&upper_word);
          bVar2 = std::operator==(&local_50,"MAX");
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar2) {
            PVar1 = kMax;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&upper_word);
            bVar2 = std::operator==(&local_50,"MIN");
            std::__cxx11::string::~string((string *)&local_50);
            if (bVar2) {
              PVar1 = kMin;
            }
            else {
              bVar2 = std::operator==(&upper_word,"ROWS");
              if (bVar2) {
                PVar1 = kRows;
              }
              else {
                bVar2 = std::operator==(&upper_word,"COLUMNS");
                if (bVar2) {
                  PVar1 = kCols;
                }
                else {
                  bVar2 = std::operator==(&upper_word,"RHS");
                  if (bVar2) {
                    PVar1 = kRhs;
                  }
                  else {
                    bVar2 = std::operator==(&upper_word,"BOUNDS");
                    if (bVar2) {
                      PVar1 = kBounds;
                    }
                    else {
                      bVar2 = std::operator==(&upper_word,"RANGES");
                      if (bVar2) {
                        PVar1 = kRanges;
                      }
                      else {
                        bVar2 = std::operator==(&upper_word,"QSECTION");
                        if (bVar2) {
                          PVar4 = kQsection;
                          goto LAB_002271ad;
                        }
                        bVar2 = std::operator==(&upper_word,"QMATRIX");
                        if (bVar2) {
                          PVar1 = kQmatrix;
                        }
                        else {
                          bVar2 = std::operator==(&upper_word,"QUADOBJ");
                          if (bVar2) {
                            PVar1 = kQuadobj;
                          }
                          else {
                            bVar2 = std::operator==(&upper_word,"QCMATRIX");
                            if (bVar2) {
                              PVar4 = kQcmatrix;
                              goto LAB_002271ad;
                            }
                            bVar2 = std::operator==(&upper_word,"CSECTION");
                            if (bVar2) {
                              PVar1 = kCsection;
                            }
                            else {
                              bVar2 = std::operator==(&upper_word,"DELAYEDROWS");
                              if (bVar2) {
                                PVar1 = kDelayedrows;
                              }
                              else {
                                bVar2 = std::operator==(&upper_word,"MODELCUTS");
                                if (bVar2) {
                                  PVar1 = kModelcuts;
                                }
                                else {
                                  bVar2 = std::operator==(&upper_word,"USERCUTS");
                                  if (bVar2) {
                                    PVar1 = kUsercuts;
                                  }
                                  else {
                                    bVar2 = std::operator==(&upper_word,"INDICATORS");
                                    if (bVar2) {
                                      PVar1 = kIndicators;
                                    }
                                    else {
                                      bVar2 = std::operator==(&upper_word,"SETS");
                                      if (bVar2) {
                                        PVar1 = kSets;
                                      }
                                      else {
                                        bVar2 = std::operator==(&upper_word,"SOS");
                                        if (bVar2) {
                                          PVar1 = kSos;
                                        }
                                        else {
                                          bVar2 = std::operator==(&upper_word,"GENCONS");
                                          if (bVar2) {
                                            PVar1 = kGencons;
                                          }
                                          else {
                                            bVar2 = std::operator==(&upper_word,"PWLOBJ");
                                            if (bVar2) {
                                              PVar1 = kPwlobj;
                                            }
                                            else {
                                              bVar2 = std::operator==(&upper_word,"PWLNAM");
                                              if (bVar2) {
                                                PVar1 = kPwlnam;
                                              }
                                              else {
                                                bVar2 = std::operator==(&upper_word,"PWLCON");
                                                if (bVar2) {
                                                  PVar1 = kPwlcon;
                                                }
                                                else {
                                                  bVar2 = std::operator==(&upper_word,"ENDATA");
                                                  if (!bVar2) {
                                                    PVar4 = kNone;
                                                    goto LAB_002271ad;
                                                  }
                                                  PVar1 = kEnd;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          bVar2 = is_end(strline,*end,&default_non_chars_abi_cxx11_);
          PVar4 = kNone;
          if (bVar2) {
            PVar4 = PVar1;
          }
        }
      }
LAB_002271ad:
      std::__cxx11::string::~string((string *)&upper_word);
      return PVar4;
    }
  }
  *end = sVar3;
  std::__cxx11::string::operator=((string *)word,(strline->_M_dataplus)._M_p[*start]);
  return kNone;
}

Assistant:

HMpsFF::Parsekey HMpsFF::checkFirstWord(std::string& strline, size_t& start,
                                        size_t& end, std::string& word) const {
  start = strline.find_first_not_of(" ");
  if ((start + 1 == strline.size()) || is_empty(strline[start + 1])) {
    end = start + 1;
    word = strline[start];
    return HMpsFF::Parsekey::kNone;
  }

  end = first_word_end(strline, start + 1);

  word = strline.substr(start, end - start);

  // Create an upper-case version of WORD, so that keywords are
  // read as if they were in lower or mixed case
  std::string upper_word = word;
  toupper(upper_word);

  // store rest of strline for keywords that have arguments
  if (upper_word == "QCMATRIX" || upper_word == "QSECTION" ||
      upper_word == "CSECTION")
    section_args = strline.substr(end, strline.length());

  HMpsFF::Parsekey key;

  if (upper_word == "NAME")
    key = HMpsFF::Parsekey::kName;
  else if (upper_word == "OBJSENSE")
    key = HMpsFF::Parsekey::kObjsense;
  else if (upper_word.substr(0, 3) == "MAX")
    key = HMpsFF::Parsekey::kMax;
  else if (upper_word.substr(0, 3) == "MIN")
    key = HMpsFF::Parsekey::kMin;
  else if (upper_word == "ROWS")
    key = HMpsFF::Parsekey::kRows;
  else if (upper_word == "COLUMNS")
    key = HMpsFF::Parsekey::kCols;
  else if (upper_word == "RHS")
    key = HMpsFF::Parsekey::kRhs;
  else if (upper_word == "BOUNDS")
    key = HMpsFF::Parsekey::kBounds;
  else if (upper_word == "RANGES")
    key = HMpsFF::Parsekey::kRanges;
  else if (upper_word == "QSECTION")
    key = HMpsFF::Parsekey::kQsection;
  else if (upper_word == "QMATRIX")
    key = HMpsFF::Parsekey::kQmatrix;
  else if (upper_word == "QUADOBJ")
    key = HMpsFF::Parsekey::kQuadobj;
  else if (upper_word == "QCMATRIX")
    key = HMpsFF::Parsekey::kQcmatrix;
  else if (upper_word == "CSECTION")
    key = HMpsFF::Parsekey::kCsection;
  else if (upper_word == "DELAYEDROWS")
    key = HMpsFF::Parsekey::kDelayedrows;
  else if (upper_word == "MODELCUTS")
    key = HMpsFF::Parsekey::kModelcuts;
  else if (upper_word == "USERCUTS")
    key = HMpsFF::Parsekey::kUsercuts;
  else if (upper_word == "INDICATORS")
    key = HMpsFF::Parsekey::kIndicators;
  else if (upper_word == "SETS")
    key = HMpsFF::Parsekey::kSets;
  else if (upper_word == "SOS")
    key = HMpsFF::Parsekey::kSos;
  else if (upper_word == "GENCONS")
    key = HMpsFF::Parsekey::kGencons;
  else if (upper_word == "PWLOBJ")
    key = HMpsFF::Parsekey::kPwlobj;
  else if (upper_word == "PWLNAM")
    key = HMpsFF::Parsekey::kPwlnam;
  else if (upper_word == "PWLCON")
    key = HMpsFF::Parsekey::kPwlcon;
  else if (upper_word == "ENDATA")
    key = HMpsFF::Parsekey::kEnd;
  else
    return HMpsFF::Parsekey::kNone;
  // Can have keywords used as column names or names of RHS, BOUND,
  // RANGES etc, so assume this if there are non-blanks after the
  // apparent keyword. Only cases that don't work are NAME, OBJSENSE,
  // QCMATRIX and QSECTION, since they can be followed by text
  if (key == HMpsFF::Parsekey::kName || key == HMpsFF::Parsekey::kObjsense ||
      key == HMpsFF::Parsekey::kQcmatrix || key == HMpsFF::Parsekey::kQsection)
    return key;
  assert(key != HMpsFF::Parsekey::kNone);

  if (is_end(strline, end)) return key;

  return HMpsFF::Parsekey::kNone;
}